

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

Json __thiscall WorldShuffler::playthrough_as_json_abi_cxx11_(WorldShuffler *this)

{
  long *plVar1;
  long lVar2;
  __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_> _Var3;
  reference this_00;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value jVar4;
  long *plVar5;
  long in_RSI;
  Json JVar6;
  Item *key_item_in_source;
  long local_48;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  *(undefined1 *)&this->_world = 0;
  (this->_solver)._world = (RandomizerWorld *)0x0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this,true);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this,true);
  plVar5 = *(long **)(in_RSI + 0x1530);
  plVar1 = *(long **)(in_RSI + 0x1538);
  jVar4 = extraout_RDX;
  if (plVar5 != plVar1) {
    do {
      lVar2 = *plVar5;
      local_48 = *(long *)(lVar2 + 0x28);
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                        (*(undefined8 *)(in_RSI + 0x1518),*(undefined8 *)(in_RSI + 0x1520),&local_48
                        );
      jVar4 = extraout_RDX_00;
      if (_Var3._M_current != *(Item ***)(in_RSI + 0x1520)) {
        local_40.m_type = null;
        local_40.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_40,(string_t *)(local_48 + 0x10));
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        this_00 = nlohmann::
                  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[]((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)this,(key_type *)(lVar2 + 8));
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(this_00,&local_40);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_40);
        jVar4 = extraout_RDX_01;
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != plVar1);
  }
  JVar6.m_value.object = jVar4.object;
  JVar6._0_8_ = this;
  return JVar6;
}

Assistant:

Json WorldShuffler::playthrough_as_json() const
{
    Json json;

    // Filter the logical playthrough to keep only strictly needed key items
    for(ItemSource* source : _logical_playthrough)
    {
        Item* key_item_in_source = source->item();
        if(std::find(_minimal_items_to_complete.begin(), _minimal_items_to_complete.end(), key_item_in_source) != _minimal_items_to_complete.end())
            json[source->name()] = key_item_in_source->name();
    }

    return json;
}